

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_loader.cpp
# Opt level: O0

XrResult xrLocateSpaces(XrSession session,XrSpacesLocateInfo *locateInfo,
                       XrSpaceLocations *spaceLocations)

{
  unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_> *this
  ;
  pointer pXVar1;
  exception *e;
  XrResult local_34;
  LoaderInstance *pLStack_30;
  XrResult result;
  LoaderInstance *loader_instance;
  XrSpaceLocations *spaceLocations_local;
  XrSpacesLocateInfo *locateInfo_local;
  XrSession session_local;
  
  loader_instance = (LoaderInstance *)spaceLocations;
  spaceLocations_local = (XrSpaceLocations *)locateInfo;
  locateInfo_local = (XrSpacesLocateInfo *)session;
  local_34 = ActiveLoaderInstance::Get(&stack0xffffffffffffffd0,"xrLocateSpaces");
  if (XR_ERROR_VALIDATION_FAILURE < local_34) {
    this = LoaderInstance::DispatchTable(pLStack_30);
    pXVar1 = std::
             unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>
             ::operator->(this);
    local_34 = (*pXVar1->LocateSpaces)
                         ((XrSession)locateInfo_local,(XrSpacesLocateInfo *)spaceLocations_local,
                          (XrSpaceLocations *)loader_instance);
  }
  return local_34;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL xrLocateSpaces(
    XrSession                                   session,
    const XrSpacesLocateInfo*                   locateInfo,
    XrSpaceLocations*                           spaceLocations) XRLOADER_ABI_TRY {
    LoaderInstance* loader_instance;
    XrResult result = ActiveLoaderInstance::Get(&loader_instance, "xrLocateSpaces");
    if (XR_SUCCEEDED(result)) {
        result = loader_instance->DispatchTable()->LocateSpaces(session, locateInfo, spaceLocations);
    }
    return result;
}